

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdbloom.cc
# Opt level: O0

bool __thiscall bloomFilter::test(bloomFilter *this,string *hex)

{
  bool bVar1;
  uint bit_00;
  reference pp_Var2;
  uint local_2c;
  int bit;
  uint32_t i;
  _func_uint32_t_string_ptr *hashfn;
  string *hex_local;
  bloomFilter *this_local;
  
  local_2c = 0;
  while( true ) {
    if (this->mNoHashs <= local_2c) {
      return true;
    }
    pp_Var2 = std::
              vector<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              ::operator[](&this->mHashFns,(ulong)local_2c);
    bit_00 = (**pp_Var2)(hex);
    bVar1 = isBitSet(this,bit_00);
    if (!bVar1) break;
    local_2c = local_2c + 1;
  }
  return false;
}

Assistant:

bool bloomFilter::test(const std::string &hex) {
	uint32_t (*hashfn)(const std::string &);
	uint32_t i;
	for (i = 0; i < mNoHashs; i++) {
		hashfn = mHashFns[i];

		int bit = hashfn(hex);

		if (!isBitSet(bit)) {
			return false;
		}
	}
	return true;
}